

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::ClipDistance::FunctionalTest::iterate(FunctionalTest *this)

{
  GLenum primitive_type_00;
  GLchar *__s;
  bool bVar1;
  int iVar2;
  socklen_t __len;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  LinkageStatus *pLVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  VertexBufferObject<float> *pVVar7;
  sockaddr *__addr;
  Functions *pFVar8;
  Enum<int,_2UL> EVar9;
  uint local_704;
  char *pcStack_700;
  GLuint i_clip_count_1;
  GetNameFunc local_6f8;
  int local_6f0;
  Enum<int,_2UL> local_6e8;
  MessageBuilder local_6d8;
  undefined1 local_558 [8];
  vector<float,_std::allocator<float>_> results;
  allocator<char> local_3b9;
  string local_3b8;
  Program local_398;
  VertexBufferObject<float> *local_318;
  VertexBufferObject<float> *vertex_buffer_object;
  VertexArrayObject vertex_array_object;
  MessageBuilder local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  Program program;
  string vertex_shader_code;
  GLuint i_clip_count;
  uint uStack_8c;
  bool redeclaration;
  GLuint i_redeclaration;
  GLuint i_clip_function;
  Framebuffer framebuffer;
  GLuint framebuffer_size;
  GLenum primitive_indices_count;
  GLenum primitive_type;
  GLuint i_primitive_type;
  allocator<char> local_49;
  string local_48;
  deUint32 local_28;
  ContextType local_24;
  Functions *local_20;
  Functions *gl;
  FunctionalTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_20 = (Functions *)CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  local_24.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_28 = (deUint32)glu::ApiType::core(3,0);
  bVar1 = glu::contextSupports(local_24,(ApiType)local_28);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"GL_ARB_clip_distance is not supported",&local_49);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_48);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  primitive_indices_count = 0;
  do {
    if (2 < primitive_indices_count) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    primitive_type_00 = m_primitive_types[primitive_indices_count];
    framebuffer.m_renderbuffer_id = m_primitive_indices[primitive_indices_count];
    __len = 0x20;
    if (primitive_type_00 == 0) {
      __len = 1;
    }
    pFVar8 = local_20;
    framebuffer.m_framebuffer_id = __len;
    Utility::Framebuffer::Framebuffer((Framebuffer *)&i_redeclaration,local_20,__len,__len);
    Utility::Framebuffer::bind((Framebuffer *)&i_redeclaration,(int)pFVar8,__addr,__len);
    for (uStack_8c = 0; uStack_8c < 4 - (primitive_indices_count == 0); uStack_8c = uStack_8c + 1) {
      for (i_clip_count = 0; i_clip_count < 2; i_clip_count = i_clip_count + 1) {
        vertex_shader_code.field_2._M_local_buf[0xf] = i_clip_count == 1;
        for (vertex_shader_code.field_2._8_4_ = 1;
            (uint)vertex_shader_code.field_2._8_4_ <= (uint)this->m_gl_max_clip_distances_value;
            vertex_shader_code.field_2._8_4_ = vertex_shader_code.field_2._8_4_ + 1) {
          prepareVertexShaderCode_abi_cxx11_
                    ((string *)&program.m_gl,this,
                     (bool)(vertex_shader_code.field_2._M_local_buf[0xf] & 1U),
                     (bool)(vertex_shader_code.field_2._M_local_buf[0xf] & 1U),
                     vertex_shader_code.field_2._8_4_,uStack_8c,primitive_type_00);
          pFVar8 = local_20;
          __s = m_fragment_shader_code;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,__s,&local_159);
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_178);
          Utility::Program::Program
                    ((Program *)local_138,pFVar8,(string *)&program.m_gl,&local_158,&local_178);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_178);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator(&local_159);
          pLVar4 = Utility::Program::ProgramStatus((Program *)local_138);
          if (pLVar4->program_id == 0) {
            pTVar5 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_2f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_2f8,
                                (char (*) [72])
                                "Functional test have failed when building program.\nVertex shader code:\n"
                               );
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&program.m_gl);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(char (*) [24])"\nFragment shader code:\n");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&m_fragment_shader_code);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_2f8);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail");
            this_local._4_4_ = STOP;
            vertex_array_object.m_primitive_type = 1;
          }
          else {
            Utility::Program::UseProgram((Program *)local_138);
            Utility::Framebuffer::clear((Framebuffer *)&i_redeclaration);
            (*local_20->enable)(vertex_shader_code.field_2._8_4_ + 0x2fff);
            Utility::VertexArrayObject::VertexArrayObject
                      ((VertexArrayObject *)&vertex_buffer_object,local_20,primitive_type_00);
            pVVar7 = prepareGeometry(this,local_20,primitive_type_00);
            local_318 = pVVar7;
            Utility::Program::Program(&local_398,(Program *)local_138);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3b8,"position",&local_3b9);
            bVar1 = Utility::VertexBufferObject<float>::useAsShaderInput
                              (pVVar7,&local_398,&local_3b8,4);
            std::__cxx11::string::~string((string *)&local_3b8);
            std::allocator<char>::~allocator(&local_3b9);
            Utility::Program::~Program(&local_398);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              Utility::VertexArrayObject::draw
                        ((VertexArrayObject *)&vertex_buffer_object,0,framebuffer.m_renderbuffer_id)
              ;
              Utility::Framebuffer::readPixels
                        ((vector<float,_std::allocator<float>_> *)local_558,
                         (Framebuffer *)&i_redeclaration);
              bVar1 = checkResults(this,primitive_type_00,uStack_8c,
                                   (vector<float,_std::allocator<float>_> *)local_558);
              pVVar7 = local_318;
              if (bVar1) {
                if (local_318 != (VertexBufferObject<float> *)0x0) {
                  Utility::VertexBufferObject<float>::~VertexBufferObject(local_318);
                  operator_delete(pVVar7,0x30);
                }
                vertex_array_object.m_primitive_type = 0;
              }
              else {
                pTVar5 = tcu::TestContext::getLog
                                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_6d8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (&local_6d8,
                                    (char (*) [42])"Functional test have failed when drawing ");
                EVar9 = glu::getPrimitiveTypeStr(primitive_type_00);
                local_6f8 = EVar9.m_getName;
                local_6f0 = EVar9.m_value;
                local_6e8.m_getName = local_6f8;
                local_6e8.m_value = local_6f0;
                pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_6e8);
                pcStack_700 = " without ";
                if ((vertex_shader_code.field_2._M_local_buf[0xf] & 1U) != 0) {
                  pcStack_700 = " with ";
                }
                pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&stack0xfffffffffffff900);
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (pMVar6,(char (*) [29])"dynamic redeclaration, when ");
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (pMVar6,(uint *)(vertex_shader_code.field_2._M_local_buf + 8));
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (pMVar6,(char (*) [61])
                                           " GL_CLIP_DISTANCES where enabled and set up using function:\n"
                                   );
                pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,m_clip_function + uStack_8c);
                tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_6d8);
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,"Fail");
                pVVar7 = local_318;
                if (local_318 != (VertexBufferObject<float> *)0x0) {
                  Utility::VertexBufferObject<float>::~VertexBufferObject(local_318);
                  operator_delete(pVVar7,0x30);
                }
                this_local._4_4_ = STOP;
                vertex_array_object.m_primitive_type = 1;
              }
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)local_558);
            }
            else {
              pTVar5 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)
                         &results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,pTVar5,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)
                                  &results.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage,
                                  (char (*) [67])
                                  "Functional test have failed when enabling vertex attribute array.\n"
                                 );
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder
                        ((MessageBuilder *)
                         &results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_INTERNAL_ERROR,"Error");
              pVVar7 = local_318;
              if (local_318 != (VertexBufferObject<float> *)0x0) {
                Utility::VertexBufferObject<float>::~VertexBufferObject(local_318);
                operator_delete(pVVar7,0x30);
              }
              this_local._4_4_ = STOP;
              vertex_array_object.m_primitive_type = 1;
            }
            Utility::VertexArrayObject::~VertexArrayObject
                      ((VertexArrayObject *)&vertex_buffer_object);
          }
          Utility::Program::~Program((Program *)local_138);
          std::__cxx11::string::~string((string *)&program.m_gl);
          if (vertex_array_object.m_primitive_type != 0) goto LAB_0119fbee;
        }
        for (local_704 = 0; local_704 < (uint)this->m_gl_max_clip_distances_value;
            local_704 = local_704 + 1) {
          (*local_20->disable)(local_704 + 0x3000);
        }
      }
    }
    vertex_array_object.m_primitive_type = 0;
LAB_0119fbee:
    Utility::Framebuffer::~Framebuffer((Framebuffer *)&i_redeclaration);
    if (vertex_array_object.m_primitive_type != 0) {
      return this_local._4_4_;
    }
    primitive_indices_count = primitive_indices_count + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult gl3cts::ClipDistance::FunctionalTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only be executed if we're running a GL>=3.0 context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)))
	{
		throw tcu::NotSupportedError("GL_ARB_clip_distance is not supported");
	}

	/* Functional test */

	/* For all primitive modes. */
	for (glw::GLuint i_primitive_type = 0; i_primitive_type < m_primitive_types_count; ++i_primitive_type)
	{
		glw::GLenum primitive_type			= m_primitive_types[i_primitive_type];
		glw::GLenum primitive_indices_count = m_primitive_indices[i_primitive_type];

		/* Framebuffer setup. */
		glw::GLuint framebuffer_size = (primitive_type == GL_POINTS) ? 1 : 32;

		gl3cts::ClipDistance::Utility::Framebuffer framebuffer(gl, framebuffer_size,
															   framebuffer_size); /* Framebuffer shall be square */

		framebuffer.bind();

		/* For all clip combinations. */
		for (glw::GLuint i_clip_function = 0;
			 i_clip_function <
			 m_clip_function_count -
				 int(i_primitive_type == GL_POINTS); /* Do not use last clip function with GL_POINTS. */
			 ++i_clip_function)
		{
			/* For both redeclaration types (implicit/explicit). */
			for (glw::GLuint i_redeclaration = 0; i_redeclaration < 2; ++i_redeclaration)
			{
				bool redeclaration = (i_redeclaration == 1);

				/* For different clip array sizes. */
				for (glw::GLuint i_clip_count = 1; i_clip_count <= glw::GLuint(m_gl_max_clip_distances_value);
					 ++i_clip_count)
				{
					/* Create and build program. */
					std::string vertex_shader_code = gl3cts::ClipDistance::FunctionalTest::prepareVertexShaderCode(
						redeclaration, redeclaration, i_clip_count, i_clip_function, primitive_type);

					gl3cts::ClipDistance::Utility::Program program(gl, vertex_shader_code, m_fragment_shader_code);

					if (program.ProgramStatus().program_id == GL_NONE)
					{
						/* Result's setup. */
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Functional test have failed when building program.\nVertex shader code:\n"
							<< vertex_shader_code << "\nFragment shader code:\n"
							<< m_fragment_shader_code << "\n"
							<< tcu::TestLog::EndMessage;

						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

						return STOP;
					}

					program.UseProgram();

					/* Framebuffer clear */
					framebuffer.clear();

					/* Clip setup */
					gl.enable(GL_CLIP_DISTANCE0 + i_clip_count - 1);

					/* Geometry Setup */
					gl3cts::ClipDistance::Utility::VertexArrayObject vertex_array_object(gl, primitive_type);

					gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLfloat>* vertex_buffer_object =
						prepareGeometry(gl, primitive_type);

					if (!vertex_buffer_object->useAsShaderInput(program, "position", 4))
					{
						/* Result's setup. */
						m_testCtx.getLog() << tcu::TestLog::Message
										   << "Functional test have failed when enabling vertex attribute array.\n"
										   << tcu::TestLog::EndMessage;

						m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");

						delete vertex_buffer_object;
						return STOP;
					}

					/* Draw geometry to the framebuffer */
					vertex_array_object.draw(0, primitive_indices_count);

					/* Check results */
					std::vector<glw::GLfloat> results = framebuffer.readPixels();

					if (!checkResults(primitive_type, i_clip_function, results))
					{
						/* Result's setup. */
						m_testCtx.getLog() << tcu::TestLog::Message << "Functional test have failed when drawing "
										   << glu::getPrimitiveTypeStr(primitive_type)
										   << ((redeclaration) ? " with " : " without ")
										   << "dynamic redeclaration, when " << i_clip_count
										   << " GL_CLIP_DISTANCES where enabled and set up using function:\n"
										   << m_clip_function[i_clip_function] << tcu::TestLog::EndMessage;

						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

						delete vertex_buffer_object;
						return STOP;
					}

					delete vertex_buffer_object;
				}

				/* Clip clean */
				for (glw::GLuint i_clip_count = 0; i_clip_count < glw::GLuint(m_gl_max_clip_distances_value);
					 ++i_clip_count)
				{
					gl.disable(GL_CLIP_DISTANCE0 + i_clip_count);
				}
			}
		}
	}

	/* Result's setup. */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}